

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengineex.cpp
# Opt level: O0

QDebug * operator<<(QDebug *s,QVectorPath *path)

{
  QDebug *this;
  QDebug *o;
  QVectorPath *in_RSI;
  QDebug *in_RDI;
  long in_FS_OFFSET;
  QRectF rf;
  QDebugStateSaver saver;
  undefined4 in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff6c;
  char t;
  QDebug *in_stack_ffffffffffffff88;
  QDebug this_00;
  QVectorPath *this_01;
  QDebug in_stack_ffffffffffffffb8;
  undefined1 local_40 [8];
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  ElementType *local_10;
  qreal *local_8;
  
  local_8 = *(qreal **)(in_FS_OFFSET + 0x28);
  local_10 = (ElementType *)&DAT_aaaaaaaaaaaaaaaa;
  this_01 = (QVectorPath *)&stack0xfffffffffffffff0;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)this_01,in_RDI);
  local_28 = 0xffffffffffffffff;
  uStack_20 = 0xffffffffffffffff;
  local_38 = 0xffffffffffffffff;
  uStack_30 = 0xffffffffffffffff;
  QVectorPath::controlPointRect(this_01);
  this = QDebug::operator<<(in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffffb8.stream);
  QVectorPath::elementCount(in_RSI);
  QDebug::operator<<(this,in_stack_ffffffffffffff6c);
  QDebug::operator<<(in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffffb8.stream);
  QDebug::operator<<(this,(QTextStreamFunction)
                          CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  QVectorPath::hints(in_RSI);
  o = QDebug::operator<<(this,in_stack_ffffffffffffff6c);
  t = (char)(in_stack_ffffffffffffff6c >> 0x18);
  QDebug::QDebug((QDebug *)&stack0xffffffffffffffb8,o);
  this_00.stream = (Stream *)local_40;
  operator<<(this_00,(QRectF *)&stack0xffffffffffffffb8);
  QDebug::operator<<(this,t);
  QDebug::~QDebug((QDebug *)this_00.stream);
  QDebug::~QDebug((QDebug *)&stack0xffffffffffffffb8);
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)this_01);
  if (*(qreal **)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDebug Q_GUI_EXPORT &operator<<(QDebug &s, const QVectorPath &path)
{
    QDebugStateSaver saver(s);
    QRectF rf = path.controlPointRect();
    s << "QVectorPath(size:" << path.elementCount()
      << " hints:" << Qt::hex << path.hints()
      << rf << ')';
    return s;
}